

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O1

void duckdb::TimeBucketFunction<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  unsigned_long *puVar1;
  char cVar2;
  reference left;
  reference right;
  int64_t iVar3;
  code *fun;
  interval_t local_38;
  
  left = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  right = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  if (left->vector_type != CONSTANT_VECTOR) {
    BinaryExecutor::
    ExecuteSwitch<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::BinaryLambdaWrapper,bool,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t)>
              (left,right,result,args->count,
               TimeBucket::BinaryOperator::
               Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>);
    return;
  }
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  local_38._0_8_ = *(undefined8 *)left->data;
  local_38.micros = *(int64_t *)(left->data + 8);
  if (local_38.months == 0) {
    iVar3 = Interval::GetMicro(&local_38);
    if (0 < iVar3) {
      cVar2 = '\0';
      goto LAB_01af9c24;
    }
  }
  cVar2 = '\x02' - ((local_38.micros == 0 && local_38.days == 0) && 0 < local_38.months);
LAB_01af9c24:
  if (cVar2 == '\x02') {
    fun = TimeBucket::BinaryOperator::
          Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>;
  }
  else if (cVar2 == '\x01') {
    fun = TimeBucket::WidthConvertibleToMonthsBinaryOperator::
          Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>;
  }
  else {
    fun = TimeBucket::WidthConvertibleToMicrosBinaryOperator::
          Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>;
  }
  BinaryExecutor::
  ExecuteSwitch<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::BinaryLambdaWrapper,bool,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t)>
            (left,right,result,args->count,fun);
  return;
}

Assistant:

static void TimeBucketFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);

	auto &bucket_width_arg = args.data[0];
	auto &ts_arg = args.data[1];

	if (bucket_width_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		if (ConstantVector::IsNull(bucket_width_arg)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			interval_t bucket_width = *ConstantVector::GetData<interval_t>(bucket_width_arg);
			TimeBucket::BucketWidthType bucket_width_type = TimeBucket::ClassifyBucketWidth(bucket_width);
			switch (bucket_width_type) {
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MICROS:
				BinaryExecutor::Execute<interval_t, T, T>(
				    bucket_width_arg, ts_arg, result, args.size(),
				    TimeBucket::WidthConvertibleToMicrosBinaryOperator::Operation<interval_t, T, T>);
				break;
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MONTHS:
				BinaryExecutor::Execute<interval_t, T, T>(
				    bucket_width_arg, ts_arg, result, args.size(),
				    TimeBucket::WidthConvertibleToMonthsBinaryOperator::Operation<interval_t, T, T>);
				break;
			case TimeBucket::BucketWidthType::UNCLASSIFIED:
				BinaryExecutor::Execute<interval_t, T, T>(bucket_width_arg, ts_arg, result, args.size(),
				                                          TimeBucket::BinaryOperator::Operation<interval_t, T, T>);
				break;
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}
	} else {
		BinaryExecutor::Execute<interval_t, T, T>(bucket_width_arg, ts_arg, result, args.size(),
		                                          TimeBucket::BinaryOperator::Operation<interval_t, T, T>);
	}
}